

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O3

bool __thiscall QMainWindow::restoreState(QMainWindow *this,QByteArray *state,int version)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  int v;
  int marker;
  int local_78;
  int local_74;
  QArrayData *local_70;
  char *local_68;
  long local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (state->d).size;
  if (lVar1 == 0) {
    bVar2 = false;
  }
  else {
    local_70 = &((state->d).d)->super_QArrayData;
    local_68 = (state->d).ptr;
    if (local_70 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_70->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_70->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_48 = 0xaaaaaaaa;
    uStack_44 = 0xaaaaaaaa;
    uStack_40 = 0xaaaaaaaa;
    uStack_3c = 0xaaaaaaaa;
    local_58 = 0xaaaaaaaa;
    uStack_54 = 0xaaaaaaaa;
    uStack_50 = 0xaaaaaaaa;
    uStack_4c = 0xaaaaaaaa;
    local_60 = lVar1;
    QDataStream::QDataStream((QDataStream *)&local_58,&local_70,1);
    uStack_40 = 0xd;
    local_74 = -0x55555556;
    local_78 = -0x55555556;
    QDataStream::operator>>((QDataStream *)&local_58,&local_74);
    QDataStream::operator>>((QDataStream *)&local_58,&local_78);
    bVar2 = false;
    if (((local_48._3_1_ == '\0') && (bVar2 = false, local_74 == 0xff)) && (local_78 == version)) {
      bVar2 = QMainWindowLayout::restoreState
                        (*(QMainWindowLayout **)(*(long *)&(this->super_QWidget).field_0x8 + 0x260),
                         (QDataStream *)&local_58);
    }
    QDataStream::~QDataStream((QDataStream *)&local_58);
    if (local_70 != (QArrayData *)0x0) {
      LOCK();
      (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_70,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QMainWindow::restoreState(const QByteArray &state, int version)
{
    if (state.isEmpty())
        return false;
    QByteArray sd = state;
    QDataStream stream(&sd, QIODevice::ReadOnly);
    stream.setVersion(QDataStream::Qt_5_0);
    int marker, v;
    stream >> marker;
    stream >> v;
    if (stream.status() != QDataStream::Ok || marker != QMainWindowLayout::VersionMarker || v != version)
        return false;
    bool restored = d_func()->layout->restoreState(stream);
    return restored;
}